

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemsave.c
# Opt level: O1

void lisp_finish(int exit_status)

{
  device_before_exit();
  exit(exit_status);
}

Assistant:

void lisp_finish(int exit_status) {
  char d[4];

  DBPRINT(("finish lisp_finish\n"));

  if (please_fork) { /* if lde runs with -NF(No fork), */
                     /* following 5 lines don't work well. */
    d[0] = 'E';
    d[3] = 1;
    /* These only happen if the fork really succeeded: */
    /* if (UnixPipeOut >= 0) write(UnixPipeOut, d, 4); */
    /* if (UnixPipeIn >= 0 read(UnixPipeIn, d, 4);*/ /* Make sure it's finished */
    /* if (UnixPID >= 0) kill(UnixPID, SIGKILL);*/   /* Then kill fork_Unix itself */
  }
  device_before_exit();
#ifdef DOS
  exit_host_filesystem();
#endif /* DOS */
  exit(exit_status);
}